

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleTimeScaleDirective(Preprocessor *this,Token directive)

{
  SourceRange range;
  SourceRange range_00;
  Token directive_00;
  byte bVar1;
  bool bVar2;
  TimeScaleDirectiveSyntax *syntax;
  Preprocessor *in_RDX;
  undefined8 in_RSI;
  Diagnostic *in_RDI;
  TimeScaleDirectiveSyntax *timeScale;
  Diagnostic *diag;
  Token slash;
  bool success;
  TimeScaleValue precision;
  TimeScaleValue unit;
  Token precisionToken;
  Token unitToken;
  TimeScaleValue *in_stack_00000108;
  Token *in_stack_00000110;
  Preprocessor *in_stack_00000118;
  Preprocessor *in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff52;
  TimeScale in_stack_ffffffffffffff54;
  SourceLocation in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  DiagCode in_stack_ffffffffffffff64;
  TimeScaleValue *in_stack_ffffffffffffff68;
  __unspec local_72;
  type local_71;
  Token local_70;
  undefined3 uVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar4;
  TimeScaleValue in_stack_ffffffffffffffa4;
  TimeScaleValue TVar5;
  TimeScaleValue in_stack_ffffffffffffffa6;
  TimeScaleValue TVar6;
  Token *in_stack_ffffffffffffffa8;
  Token *in_stack_ffffffffffffffb0;
  Token *in_stack_ffffffffffffffb8;
  BumpAllocator *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  TokenKind kind;
  Preprocessor *in_stack_ffffffffffffffd0;
  Trivia local_10;
  
  kind = (TokenKind)((ulong)in_stack_ffffffffffffffc8 >> 0x30);
  if (0 < *(int *)((long)&(in_RDI->ranges).
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4)) {
    directive_00.info._0_4_ = in_stack_ffffffffffffff60;
    directive_00._0_8_ = in_stack_ffffffffffffff58;
    directive_00.info._4_4_ = in_stack_ffffffffffffff64;
    kind = (TokenKind)((ulong)in_RSI >> 0x30);
    checkOutsideDesignElement
              ((Preprocessor *)
               CONCAT44(in_stack_ffffffffffffff54,
                        CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),directive_00)
    ;
    in_stack_ffffffffffffffd0 = in_RDX;
  }
  Token::Token((Token *)in_RDI);
  Token::Token((Token *)in_RDI);
  TimeScaleValue::TimeScaleValue((TimeScaleValue *)&stack0xffffffffffffffa6);
  TimeScaleValue::TimeScaleValue((TimeScaleValue *)&stack0xffffffffffffffa4);
  bVar1 = expectTimeScaleSpecifier(in_stack_00000118,in_stack_00000110,in_stack_00000108);
  uVar3 = (undefined3)in_stack_ffffffffffffffa0;
  local_70 = expect(in_stack_ffffffffffffffd0,kind);
  bVar2 = expectTimeScaleSpecifier(in_stack_00000118,in_stack_00000110,in_stack_00000108);
  bVar2 = (bVar1 & 1) != 0 || bVar2;
  uVar4 = CONCAT13(bVar2,uVar3);
  if (bVar2) {
    local_71 = (type)TimeScaleValue::operator<=>
                               (in_stack_ffffffffffffff68,
                                (TimeScaleValue *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    std::__cmp_cat::__unspec::__unspec(&local_72,(__unspec *)0x0);
    bVar2 = std::operator>(local_71);
    if (bVar2) {
      Token::range((Token *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      range_00.startLoc._2_2_ = in_stack_ffffffffffffff52;
      range_00.startLoc._0_2_ = in_stack_ffffffffffffff50;
      range_00.startLoc._4_1_ = in_stack_ffffffffffffff54.base.unit;
      range_00.startLoc._5_1_ = in_stack_ffffffffffffff54.base.magnitude;
      range_00.startLoc._6_1_ = in_stack_ffffffffffffff54.precision.unit;
      range_00.startLoc._7_1_ = in_stack_ffffffffffffff54.precision.magnitude;
      range_00.endLoc = in_stack_ffffffffffffff58;
      addDiag(in_stack_ffffffffffffff48,in_stack_ffffffffffffff64,range_00);
      Token::range((Token *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      range.endLoc._0_2_ = in_stack_ffffffffffffff50;
      range.startLoc = (SourceLocation)in_stack_ffffffffffffff48;
      range.endLoc._2_2_ = in_stack_ffffffffffffff52;
      range.endLoc._4_1_ = in_stack_ffffffffffffff54.base.unit;
      range.endLoc._5_1_ = in_stack_ffffffffffffff54.base.magnitude;
      range.endLoc._6_1_ = in_stack_ffffffffffffff54.precision.unit;
      range.endLoc._7_1_ = in_stack_ffffffffffffff54.precision.magnitude;
      Diagnostic::operator<<(in_RDI,range);
    }
    else {
      TVar5 = in_stack_ffffffffffffffa4;
      TVar6 = in_stack_ffffffffffffffa6;
      TimeScale::TimeScale
                ((TimeScale *)&stack0xffffffffffffff54,in_stack_ffffffffffffffa6,
                 in_stack_ffffffffffffffa4);
      std::optional<slang::TimeScale>::operator=
                ((optional<slang::TimeScale> *)
                 CONCAT44(in_stack_ffffffffffffff54,
                          CONCAT22(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa4)),
                 (TimeScale *)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffffa4 = TVar5;
      in_stack_ffffffffffffffa6 = TVar6;
    }
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::TimeScaleDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8,
                      (Token *)CONCAT26(in_stack_ffffffffffffffa6,
                                        CONCAT24(in_stack_ffffffffffffffa4,uVar4)));
  Trivia::Trivia(&local_10,Directive,(SyntaxNode *)syntax);
  return local_10;
}

Assistant:

Trivia Preprocessor::handleTimeScaleDirective(Token directive) {
    if (options.languageVersion >= LanguageVersion::v1800_2023)
        checkOutsideDesignElement(directive);

    Token unitToken, precisionToken;
    TimeScaleValue unit, precision;
    bool success = expectTimeScaleSpecifier(unitToken, unit);

    auto slash = expect(TokenKind::Slash);
    success |= expectTimeScaleSpecifier(precisionToken, precision);

    if (success) {
        // Precision must be equal to or smaller than the unit (i.e. more precise).
        if (precision > unit) {
            auto& diag = addDiag(diag::InvalidTimeScalePrecision, precisionToken.range());
            diag << unitToken.range();
        }
        else {
            activeTimeScale = {unit, precision};
        }
    }

    auto timeScale = alloc.emplace<TimeScaleDirectiveSyntax>(directive, unitToken, slash,
                                                             precisionToken);
    return Trivia(TriviaKind::Directive, timeScale);
}